

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

optional<double> read_real(string_view buf)

{
  string_view lhs;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  const_pointer __first;
  char *__result;
  undefined8 extraout_RAX_01;
  undefined8 extraout_RAX_02;
  undefined8 uVar4;
  undefined1 auVar5 [64];
  optional<double> oVar6;
  double dStack_1b0;
  int read;
  double result;
  char buffer [320];
  size_t max_digits;
  string_view local_48;
  size_t local_38;
  char *local_30;
  undefined1 local_28 [8];
  string_view buf_local;
  undefined1 local_10;
  
  buf_local._M_len = (size_t)buf._M_str;
  local_28 = (undefined1  [8])buf._M_len;
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
  if (2 < sVar3) {
    local_38 = (size_t)local_28;
    local_30 = (char *)buf_local._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_48,"inf");
    lhs._M_str = local_30;
    lhs._M_len = local_38;
    bVar1 = are_equal(lhs,local_48);
    if (bVar1) {
      max_digits = (size_t)std::numeric_limits<double>::infinity();
      std::optional<double>::optional<double,_true>
                ((optional<double> *)&buf_local._M_str,(double *)&max_digits);
      uVar4 = extraout_RAX;
      goto LAB_0014360a;
    }
  }
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
  if (sVar3 < 0x141) {
    auVar5 = ZEXT1664((undefined1  [16])0x0);
    buffer._248_64_ = vmovdqu64_avx512f(auVar5);
    buffer._184_64_ = vmovdqu64_avx512f(auVar5);
    buffer._120_64_ = vmovdqu64_avx512f(auVar5);
    buffer._56_64_ = vmovdqu64_avx512f(auVar5);
    _result = vmovdqu64_avx512f(auVar5);
    __first = std::basic_string_view<char,_std::char_traits<char>_>::data
                        ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
    __result = std::begin<char,320ul>((char (*) [320])&result);
    std::copy_n<char_const*,unsigned_long,char*>(__first,sVar3,__result);
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                      ((basic_string_view<char,_std::char_traits<char>_> *)local_28);
    buffer[sVar3 - 8] = '\0';
    dStack_1b0 = 0.0;
    iVar2 = __isoc99_sscanf(&result,"%lf",&stack0xfffffffffffffe50);
    if (iVar2 < 1) {
      std::optional<double>::optional((optional<double> *)&buf_local._M_str);
      uVar4 = extraout_RAX_02;
    }
    else {
      std::optional<double>::optional<double,_true>
                ((optional<double> *)&buf_local._M_str,&stack0xfffffffffffffe50);
      uVar4 = extraout_RAX_01;
    }
  }
  else {
    std::optional<double>::optional((optional<double> *)&buf_local._M_str);
    uVar4 = extraout_RAX_00;
  }
LAB_0014360a:
  oVar6.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _9_7_ = (undefined7)((ulong)uVar4 >> 8);
  oVar6.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_engaged = (bool)local_10;
  oVar6.super__Optional_base<double,_true,_true>._M_payload.super__Optional_payload_base<double>.
  _M_payload = (_Storage<double,_true>)buf_local._M_str;
  return (optional<double>)
         oVar6.super__Optional_base<double,_true,_true>._M_payload.
         super__Optional_payload_base<double>;
}

Assistant:

std::optional<double>
read_real(const std::string_view buf) noexcept
{
    if (buf.size() >= 3 && are_equal(buf, "inf"))
        return std::numeric_limits<double>::infinity();

    constexpr std::size_t max_digits = 320;
    if (buf.size() > max_digits)
        return std::nullopt;

    char buffer[max_digits] = { '\0' };
    std::copy_n(buf.data(), buf.size(), std::begin(buffer));
    buffer[buf.size()] = '\0';

    double result = 0;
    if (auto read = std::sscanf(buffer, "%lf", &result); read > 0)
        return result;
    else
        return std::nullopt;
}